

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBoxPrivate::editorTextChanged(QAbstractSpinBoxPrivate *this,QString *t)

{
  long *plVar1;
  bool doUpdate;
  int iVar2;
  long in_FS_OFFSET;
  int pos;
  QArrayDataPointer<char16_t> local_60;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)&this->field_0x3d0 & 0x40) == 0) {
    *(ushort *)&this->field_0x3d0 = *(ushort *)&this->field_0x3d0 | 1;
  }
  else {
    plVar1 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
    local_60.d = (t->d).d;
    local_60.ptr = (t->d).ptr;
    local_60.size = (t->d).size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLineEdit::cursorPosition(this->edit);
    iVar2 = (**(code **)(*plVar1 + 0x1a0))(plVar1,&local_60);
    if (iVar2 == 2) {
      local_48._16_4_ = 0xaaaaaaaa;
      local_48._20_4_ = 0xaaaaaaaa;
      uStack_30 = 0xaaaaaaaa;
      uStack_2c = 0xaaaaaaaa;
      local_48._0_4_ = 0xaaaaaaaa;
      local_48._4_4_ = 0xaaaaaaaa;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xe0))(&local_48,this,&local_60);
      doUpdate = ::operator!=((QString *)&local_60,t);
      setValue(this,(QVariant *)&local_48,EmitIfChanged,doUpdate);
      this->field_0x3d0 = this->field_0x3d0 & 0xfe;
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    else {
      this->field_0x3d0 = this->field_0x3d0 | 1;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::editorTextChanged(const QString &t)
{
    Q_Q(QAbstractSpinBox);

    if (keyboardTracking) {
        QString tmp = t;
        int pos = edit->cursorPosition();
        QValidator::State state = q->validate(tmp, pos);
        if (state == QValidator::Acceptable) {
            const QVariant v = valueFromText(tmp);
            setValue(v, EmitIfChanged, tmp != t);
            pendingEmit = false;
        } else {
            pendingEmit = true;
        }
    } else {
        pendingEmit = true;
    }
}